

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_writable_flags(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  undefined1 local_218 [16];
  uv_tcp_t server;
  uv_shutdown_t shutdown_req;
  uv_write_t write_req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&server,0x80,0);
        if (iVar1 == 0) {
          iVar1 = uv_is_writable(&server);
          if (iVar1 == 0) {
            iVar1 = uv_is_readable(&server);
            if (iVar1 == 0) {
              local_218 = uv_buf_init("PING",4);
              iVar1 = uv_write(&write_req,&server,local_218,1,0);
              if (iVar1 == -0x20) {
                iVar1 = uv_shutdown(&shutdown_req,&server,0);
                if (iVar1 == -0x6b) {
                  iVar1 = uv_read_start(&server,0,0);
                  if (iVar1 == -0x6b) {
                    uv_close(&server,close_cb);
                    uVar2 = uv_default_loop();
                    uv_run(uVar2,0);
                    if (close_cb_called == 1) {
                      loop = (uv_loop_t *)uv_default_loop();
                      close_loop(loop);
                      uVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(uVar2);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                      uVar2 = 0xfc;
                    }
                    else {
                      pcVar3 = "close_cb_called == 1";
                      uVar2 = 0xfa;
                    }
                  }
                  else {
                    pcVar3 = "r == UV_ENOTCONN";
                    uVar2 = 0xf4;
                  }
                }
                else {
                  pcVar3 = "r == UV_ENOTCONN";
                  uVar2 = 0xf2;
                }
              }
              else {
                pcVar3 = "r == UV_EPIPE";
                uVar2 = 0xf0;
              }
            }
            else {
              pcVar3 = "0 == uv_is_readable((uv_stream_t*) &server)";
              uVar2 = 0xec;
            }
          }
          else {
            pcVar3 = "0 == uv_is_writable((uv_stream_t*) &server)";
            uVar2 = 0xeb;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0xe9;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xe7;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0xe5;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uVar2 = 0xe3;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_writable_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_buf_t buf;
  uv_write_t write_req;
  uv_shutdown_t shutdown_req;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_writable((uv_stream_t*) &server));
  ASSERT(0 == uv_is_readable((uv_stream_t*) &server));

  buf = uv_buf_init("PING", 4);
  r = uv_write(&write_req, (uv_stream_t*) &server, &buf, 1, NULL);
  ASSERT(r == UV_EPIPE);
  r = uv_shutdown(&shutdown_req, (uv_stream_t*) &server, NULL);
  ASSERT(r == UV_ENOTCONN);
  r = uv_read_start((uv_stream_t*) &server, NULL, NULL);
  ASSERT(r == UV_ENOTCONN);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}